

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::HttpServer::HttpServer
          (HttpServer *this,Timer *timer,HttpHeaderTable *requestHeaderTable,HttpService *service,
          Settings *settings)

{
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
  local_88;
  SourceLocation in_stack_ffffffffffffff90;
  Settings local_58;
  
  local_88.tag = 1;
  local_58.headerTimeout.value = (settings->headerTimeout).value;
  local_58.pipelineTimeout.value = (settings->pipelineTimeout).value;
  local_58.canceledUploadGracePeriod.value = (settings->canceledUploadGracePeriod).value;
  local_58.canceledUploadGraceBytes = settings->canceledUploadGraceBytes;
  local_58.errorHandler.ptr = (settings->errorHandler).ptr;
  local_58.callbacks.ptr = (settings->callbacks).ptr;
  local_58.webSocketErrorHandler.ptr = (settings->webSocketErrorHandler).ptr;
  local_58.webSocketCompressionMode = settings->webSocketCompressionMode;
  local_88.field_1._0_8_ = service;
  newPromiseAndFulfiller<void>(in_stack_ffffffffffffff90);
  HttpServer(this,timer,requestHeaderTable,&local_88,&local_58,
             (PromiseFulfillerPair<void> *)&stack0xffffffffffffff90);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<void> *)&stack0xffffffffffffff90);
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
  ::~OneOf(&local_88);
  return;
}

Assistant:

HttpServer::HttpServer(kj::Timer& timer, const HttpHeaderTable& requestHeaderTable,
                       HttpService& service, Settings settings)
    : HttpServer(timer, requestHeaderTable, &service, settings,
                 kj::newPromiseAndFulfiller<void>()) {}